

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UdpConnection.cpp
# Opt level: O3

ssize_t __thiscall
Liby::UdpConnection::send(UdpConnection *this,int __fd,void *__buf,size_t __n,int __flags)

{
  undefined8 this_00;
  _Head_base<0UL,_std::function<void_()>_*,_false> __ptr;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  __uniq_ptr_data<std::function<void_()>,_std::default_delete<std::function<void_()>_>,_true,_true>
  this_01;
  UdpSocket *pUVar2;
  UdpSocket *extraout_RAX;
  UdpSocket *extraout_RAX_00;
  undefined4 in_register_00000034;
  bool bVar3;
  undefined1 local_59;
  undefined1 local_58 [24];
  _Head_base<0UL,_std::function<void_()>_*,_false> local_40;
  Buffer *local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_30 [2];
  off_t local_20;
  
  if (this->socket_ != (UdpSocket *)0x0) {
    local_58._8_8_ = (element_type *)0x0;
    local_58._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_40._M_head_impl = (function<void_()> *)0x0;
    local_20 = Buffer::capacity((Buffer *)CONCAT44(in_register_00000034,__fd));
    local_38 = (Buffer *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<Liby::Buffer,std::allocator<Liby::Buffer>,long>
              (a_Stack_30,&local_38,(allocator<Liby::Buffer> *)&local_59,&local_20);
    _Var1._M_pi = a_Stack_30[0]._M_pi;
    local_58._8_8_ = local_38;
    this_00 = local_58._16_8_;
    local_38 = (Buffer *)0x0;
    a_Stack_30[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_58._16_8_ = _Var1._M_pi;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00 !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00);
      if (a_Stack_30[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_30[0]._M_pi);
      }
    }
    Buffer::swap((Buffer *)local_58._8_8_,(Buffer *)CONCAT44(in_register_00000034,__fd));
    local_58._0_8_ = &this->peer_;
    if (*(long *)((long)__buf + 0x10) != 0) {
      this_01.
      super___uniq_ptr_impl<std::function<void_()>,_std::default_delete<std::function<void_()>_>_>.
      _M_t.
      super__Tuple_impl<0UL,_std::function<void_()>_*,_std::default_delete<std::function<void_()>_>_>
      .super__Head_base<0UL,_std::function<void_()>_*,_false>._M_head_impl =
           (__uniq_ptr_impl<std::function<void_()>,_std::default_delete<std::function<void_()>_>_>)
           operator_new(0x20);
      std::function<void_()>::function
                ((function<void_()> *)
                 this_01.
                 super___uniq_ptr_impl<std::function<void_()>,_std::default_delete<std::function<void_()>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::function<void_()>_*,_std::default_delete<std::function<void_()>_>_>
                 .super__Head_base<0UL,_std::function<void_()>_*,_false>._M_head_impl,
                 (function<void_()> *)__buf);
      __ptr._M_head_impl = local_40._M_head_impl;
      bVar3 = (__uniq_ptr_impl<std::function<void_()>,_std::default_delete<std::function<void_()>_>_>
               )local_40._M_head_impl !=
              (__uniq_ptr_impl<std::function<void_()>,_std::default_delete<std::function<void_()>_>_>
               )0x0;
      local_40._M_head_impl =
           (function<void_()> *)
           this_01.
           super___uniq_ptr_impl<std::function<void_()>,_std::default_delete<std::function<void_()>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::function<void_()>_*,_std::default_delete<std::function<void_()>_>_>
           .super__Head_base<0UL,_std::function<void_()>_*,_false>._M_head_impl;
      if (bVar3) {
        std::default_delete<std::function<void_()>_>::operator()
                  ((default_delete<std::function<void_()>_> *)&local_40,__ptr._M_head_impl);
      }
    }
    pUVar2 = this->socket_;
    std::deque<Liby::udp_io_task,_std::allocator<Liby::udp_io_task>_>::
    emplace_back<Liby::udp_io_task>(&pUVar2->writTasks_,(udp_io_task *)local_58);
    pUVar2 = UdpSocket::enableWrit(pUVar2,true);
    if ((_Head_base<0UL,_std::function<void_()>_*,_false>)local_40._M_head_impl !=
        (_Head_base<0UL,_std::function<void_()>_*,_false>)0x0) {
      std::default_delete<std::function<void_()>_>::operator()
                ((default_delete<std::function<void_()>_> *)&local_40,local_40._M_head_impl);
      pUVar2 = extraout_RAX;
    }
    local_40._M_head_impl = (function<void_()> *)0x0;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._16_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._16_8_);
      pUVar2 = extraout_RAX_00;
    }
    return (ssize_t)pUVar2;
  }
  __assert_fail("socket_",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/UdpConnection.cpp"
                ,0x13,"void Liby::UdpConnection::send(Liby::Buffer &, const BasicHandler &)");
}

Assistant:

void UdpConnection::send(Liby::Buffer &buf, const BasicHandler &handler) {
    assert(socket_);
    udp_io_task utask;
    utask.buffer_ = std::make_shared<Buffer>(buf.capacity());
    utask.buffer_->swap(buf);
    utask.dest_ = &peer_;
    if (handler) {
        utask.handler_ = std::make_unique<BasicHandler>(handler);
    }
    socket_->send(std::move(utask));
}